

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O1

ParserResult * __thiscall
Catch::Clara::Detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp:2959:43)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_catch_amalgamated_cpp:2959:43)>
          *this,string *arg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ColourMode CVar2;
  _Alloc_hider _Var3;
  long *plVar4;
  size_type *psVar5;
  StringRef colourMode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  Optional<Catch::ColourMode> maybeMode;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  undefined **local_70;
  undefined8 local_68;
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  ColourMode *local_40 [2];
  
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_assign((string *)&local_90);
  local_68 = 0;
  local_70 = &PTR__BasicResult_00323948;
  local_58 = 0;
  local_50 = 0;
  local_60 = &local_50;
  toLower(&local_d0,&local_90);
  _Var3._M_p = local_d0._M_dataplus._M_p;
  paVar1 = &local_d0.field_2;
  colourMode.m_size = (size_type)local_d0._M_dataplus._M_p;
  colourMode.m_start = (char *)local_40;
  Catch::Detail::stringToColourMode(colourMode);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p != paVar1) {
    operator_delete(_Var3._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_40[0] == (ColourMode *)0x0) {
    std::operator+(&local_b0,"colour mode must be one of: default, ansi, win32, or none. \'",
                   &local_90);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_d0.field_2._M_allocated_capacity = *psVar5;
      local_d0.field_2._8_8_ = plVar4[3];
      local_d0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar5;
      local_d0._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_d0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    BasicResult<Catch::Clara::ParseResultType>::BasicResult
              (__return_storage_ptr__,RuntimeError,&local_d0);
  }
  else {
    CVar2 = *local_40[0];
    if ((CVar2 < 4) && (CVar2 != Win32)) {
      ((this->m_lambda).config)->defaultColourMode = CVar2;
      *(undefined8 *)
       &(__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).
        super_ResultBase.m_type = 0;
      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).
      super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_00323948;
      (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
      (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
      (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
      goto LAB_0016ea1f;
    }
    std::operator+(&local_b0,"colour mode \'",&local_90);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_d0.field_2._M_allocated_capacity = *psVar5;
      local_d0.field_2._8_8_ = plVar4[3];
      local_d0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar5;
      local_d0._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_d0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    BasicResult<Catch::Clara::ParseResultType>::BasicResult
              (__return_storage_ptr__,RuntimeError,&local_d0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
LAB_0016ea1f:
  local_70 = &PTR__BasicResult_00323948;
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const& arg )
                    -> ParserResult override {
                    return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>(
                        m_lambda, arg );
                }